

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined4 uVar74;
  undefined1 auVar75 [32];
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2888;
  ulong *local_2878;
  undefined1 local_2840 [16];
  long local_2828;
  Scene *local_2820;
  long local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  RTCHitN local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined4 local_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  uint local_2620;
  uint uStack_261c;
  uint uStack_2618;
  uint uStack_2614;
  uint uStack_2610;
  uint uStack_260c;
  uint uStack_2608;
  uint uStack_2604;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar44 [32];
  
  local_2878 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar101 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar102 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar103 = ZEXT3264(local_2780);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar76 * 0.99999964)));
  auVar104 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar84 * 0.99999964)));
  auVar105 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar91 * 0.99999964)));
  auVar106 = ZEXT3264(local_27e0);
  fVar76 = fVar76 * 1.0000004;
  fVar84 = fVar84 * 1.0000004;
  fVar91 = fVar91 * 1.0000004;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar2;
  local_2600._0_4_ = iVar2;
  local_2600._8_4_ = iVar2;
  local_2600._12_4_ = iVar2;
  local_2600._16_4_ = iVar2;
  local_2600._20_4_ = iVar2;
  local_2600._24_4_ = iVar2;
  local_2600._28_4_ = iVar2;
  auVar98 = ZEXT3264(local_2600);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar67 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar39 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar99 = ZEXT3264(auVar39);
  auVar100 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_25a0 = fVar76;
  fStack_259c = fVar76;
  fStack_2598 = fVar76;
  fStack_2594 = fVar76;
  fStack_2590 = fVar76;
  fStack_258c = fVar76;
  fStack_2588 = fVar76;
  fStack_2584 = fVar76;
  local_25c0 = fVar84;
  fStack_25bc = fVar84;
  fStack_25b8 = fVar84;
  fStack_25b4 = fVar84;
  fStack_25b0 = fVar84;
  fStack_25ac = fVar84;
  fStack_25a8 = fVar84;
  fStack_25a4 = fVar84;
  local_25e0 = fVar91;
  fStack_25dc = fVar91;
  fStack_25d8 = fVar91;
  fStack_25d4 = fVar91;
  fStack_25d0 = fVar91;
  fStack_25cc = fVar91;
  fStack_25c8 = fVar91;
  fStack_25c4 = fVar91;
  fVar78 = fVar76;
  fVar79 = fVar76;
  fVar80 = fVar76;
  fVar81 = fVar76;
  fVar82 = fVar76;
  fVar83 = fVar76;
  fVar85 = fVar84;
  fVar86 = fVar84;
  fVar87 = fVar84;
  fVar88 = fVar84;
  fVar89 = fVar84;
  fVar90 = fVar84;
  fVar92 = fVar91;
  fVar93 = fVar91;
  fVar94 = fVar91;
  fVar95 = fVar91;
  fVar96 = fVar91;
  fVar97 = fVar91;
LAB_01db163f:
  do {
    if (local_2878 == &local_23a0) {
      return;
    }
    pfVar1 = (float *)(local_2878 + -1);
    local_2878 = local_2878 + -2;
  } while (*(float *)(ray + k * 4 + 0x80) < *pfVar1);
  uVar35 = *local_2878;
LAB_01db1670:
  do {
    if ((uVar35 & 8) != 0) break;
    auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + uVar33),auVar101._0_32_);
    auVar39 = vmulps_avx512vl(auVar104._0_32_,auVar39);
    auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + uVar34),auVar102._0_32_);
    auVar40 = vmulps_avx512vl(auVar105._0_32_,auVar40);
    auVar39 = vmaxps_avx(auVar39,auVar40);
    auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + uVar31),auVar103._0_32_);
    auVar40 = vmulps_avx512vl(auVar106._0_32_,auVar40);
    auVar40 = vmaxps_avx(auVar40,auVar98._0_32_);
    auVar39 = vmaxps_avx(auVar39,auVar40);
    auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + (uVar33 ^ 0x20)),
                              auVar101._0_32_);
    auVar18._4_4_ = fVar78 * auVar40._4_4_;
    auVar18._0_4_ = fVar76 * auVar40._0_4_;
    auVar18._8_4_ = fVar79 * auVar40._8_4_;
    auVar18._12_4_ = fVar80 * auVar40._12_4_;
    auVar18._16_4_ = fVar81 * auVar40._16_4_;
    auVar18._20_4_ = fVar82 * auVar40._20_4_;
    auVar18._24_4_ = fVar83 * auVar40._24_4_;
    auVar18._28_4_ = auVar40._28_4_;
    auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + (uVar34 ^ 0x20)),
                              auVar102._0_32_);
    auVar19._4_4_ = fVar85 * auVar40._4_4_;
    auVar19._0_4_ = fVar84 * auVar40._0_4_;
    auVar19._8_4_ = fVar86 * auVar40._8_4_;
    auVar19._12_4_ = fVar87 * auVar40._12_4_;
    auVar19._16_4_ = fVar88 * auVar40._16_4_;
    auVar19._20_4_ = fVar89 * auVar40._20_4_;
    auVar19._24_4_ = fVar90 * auVar40._24_4_;
    auVar19._28_4_ = auVar40._28_4_;
    auVar40 = vminps_avx(auVar18,auVar19);
    auVar41 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40 + (uVar31 ^ 0x20)),
                              auVar103._0_32_);
    auVar20._4_4_ = fVar92 * auVar41._4_4_;
    auVar20._0_4_ = fVar91 * auVar41._0_4_;
    auVar20._8_4_ = fVar93 * auVar41._8_4_;
    auVar20._12_4_ = fVar94 * auVar41._12_4_;
    auVar20._16_4_ = fVar95 * auVar41._16_4_;
    auVar20._20_4_ = fVar96 * auVar41._20_4_;
    auVar20._24_4_ = fVar97 * auVar41._24_4_;
    auVar20._28_4_ = auVar41._28_4_;
    auVar41 = vminps_avx(auVar20,auVar67._0_32_);
    auVar40 = vminps_avx(auVar40,auVar41);
    uVar37 = vcmpps_avx512vl(auVar39,auVar40,2);
    bVar29 = (byte)uVar37;
    if (bVar29 == 0) goto LAB_01db163f;
    auVar40 = *(undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0);
    auVar41 = ((undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0))[1];
    auVar42 = vpternlogd_avx512vl(auVar99._0_32_,auVar39,auVar100._0_32_,0xf8);
    auVar43 = vpcompressd_avx512vl(auVar42);
    auVar44._0_4_ = (uint)(bVar29 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar29 & 1) * auVar42._0_4_;
    bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
    auVar44._4_4_ = (uint)bVar36 * auVar43._4_4_ | (uint)!bVar36 * auVar42._4_4_;
    bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
    auVar44._8_4_ = (uint)bVar36 * auVar43._8_4_ | (uint)!bVar36 * auVar42._8_4_;
    bVar36 = (bool)((byte)(uVar37 >> 3) & 1);
    auVar44._12_4_ = (uint)bVar36 * auVar43._12_4_ | (uint)!bVar36 * auVar42._12_4_;
    bVar36 = (bool)((byte)(uVar37 >> 4) & 1);
    auVar44._16_4_ = (uint)bVar36 * auVar43._16_4_ | (uint)!bVar36 * auVar42._16_4_;
    bVar36 = (bool)((byte)(uVar37 >> 5) & 1);
    auVar44._20_4_ = (uint)bVar36 * auVar43._20_4_ | (uint)!bVar36 * auVar42._20_4_;
    bVar36 = (bool)((byte)(uVar37 >> 6) & 1);
    auVar44._24_4_ = (uint)bVar36 * auVar43._24_4_ | (uint)!bVar36 * auVar42._24_4_;
    bVar36 = SUB81(uVar37 >> 7,0);
    auVar44._28_4_ = (uint)bVar36 * auVar43._28_4_ | (uint)!bVar36 * auVar42._28_4_;
    auVar42 = vpermt2q_avx512vl(auVar40,auVar44,auVar41);
    uVar35 = auVar42._0_8_;
    bVar29 = bVar29 - 1 & bVar29;
    if (bVar29 != 0) {
      auVar42 = vpshufd_avx2(auVar44,0x55);
      vpermt2q_avx512vl(auVar40,auVar42,auVar41);
      auVar43 = vpminsd_avx2(auVar44,auVar42);
      auVar42 = vpmaxsd_avx2(auVar44,auVar42);
      bVar29 = bVar29 - 1 & bVar29;
      if (bVar29 == 0) {
        auVar43 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
        uVar35 = auVar43._0_8_;
        auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
        *local_2878 = auVar40._0_8_;
        lVar25 = 8;
        lStack_2888 = 0x10;
      }
      else {
        auVar59 = vpshufd_avx2(auVar44,0xaa);
        vpermt2q_avx512vl(auVar40,auVar59,auVar41);
        auVar45 = vpminsd_avx2(auVar43,auVar59);
        auVar43 = vpmaxsd_avx2(auVar43,auVar59);
        auVar59 = vpminsd_avx2(auVar42,auVar43);
        auVar43 = vpmaxsd_avx2(auVar42,auVar43);
        bVar29 = bVar29 - 1 & bVar29;
        if (bVar29 == 0) {
          auVar42 = vpermi2q_avx512vl(auVar45,auVar40,auVar41);
          uVar35 = auVar42._0_8_;
          auVar42 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
          *local_2878 = auVar42._0_8_;
          auVar42 = vpermd_avx2(auVar43,auVar39);
          *(int *)(local_2878 + 1) = auVar42._0_4_;
          auVar40 = vpermt2q_avx512vl(auVar40,auVar59,auVar41);
          local_2878[2] = auVar40._0_8_;
          lStack_2888 = 0x18;
          lVar25 = lStack_2888;
          lStack_2888 = 0x20;
          auVar42 = auVar59;
        }
        else {
          auVar42 = vpshufd_avx2(auVar44,0xff);
          vpermt2q_avx512vl(auVar40,auVar42,auVar41);
          auVar47 = vpminsd_avx2(auVar45,auVar42);
          auVar45 = vpmaxsd_avx2(auVar45,auVar42);
          auVar42 = vpminsd_avx2(auVar59,auVar45);
          auVar45 = vpmaxsd_avx2(auVar59,auVar45);
          auVar59 = vpminsd_avx2(auVar43,auVar45);
          auVar43 = vpmaxsd_avx2(auVar43,auVar45);
          bVar29 = bVar29 - 1 & bVar29;
          if (bVar29 != 0) {
            auVar46 = valignd_avx512vl(auVar44,auVar44,3);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar47 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar45,auVar47);
            auVar45 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar42 = vpermt2d_avx512vl(auVar47,auVar45,auVar42);
            auVar45 = vpermt2d_avx512vl(auVar42,auVar45,auVar59);
            auVar42 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar42 = vpermt2d_avx512vl(auVar45,auVar42,auVar43);
            auVar101 = ZEXT3264(auVar42);
            bVar27 = bVar29;
            do {
              auVar43 = auVar101._0_32_;
              auVar70._8_4_ = 1;
              auVar70._0_8_ = 0x100000001;
              auVar70._12_4_ = 1;
              auVar70._16_4_ = 1;
              auVar70._20_4_ = 1;
              auVar70._24_4_ = 1;
              auVar70._28_4_ = 1;
              auVar42 = vpermd_avx2(auVar70,auVar46);
              auVar46 = valignd_avx512vl(auVar46,auVar46,1);
              vpermt2q_avx512vl(auVar40,auVar46,auVar41);
              bVar27 = bVar27 - 1 & bVar27;
              uVar14 = vpcmpd_avx512vl(auVar42,auVar43,5);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              bVar15 = (byte)uVar14 << 1;
              auVar43 = valignd_avx512vl(auVar43,auVar43,7);
              bVar36 = (bool)((byte)uVar14 & 1);
              bVar7 = (bool)(bVar15 >> 2 & 1);
              bVar8 = (bool)(bVar15 >> 3 & 1);
              bVar9 = (bool)(bVar15 >> 4 & 1);
              bVar10 = (bool)(bVar15 >> 5 & 1);
              bVar11 = (bool)(bVar15 >> 6 & 1);
              auVar101 = ZEXT3264(CONCAT428((uint)(bVar15 >> 7) * auVar43._28_4_ |
                                            (uint)!(bool)(bVar15 >> 7) * auVar42._28_4_,
                                            CONCAT424((uint)bVar11 * auVar43._24_4_ |
                                                      (uint)!bVar11 * auVar42._24_4_,
                                                      CONCAT420((uint)bVar10 * auVar43._20_4_ |
                                                                (uint)!bVar10 * auVar42._20_4_,
                                                                CONCAT416((uint)bVar9 *
                                                                          auVar43._16_4_ |
                                                                          (uint)!bVar9 *
                                                                          auVar42._16_4_,
                                                                          CONCAT412((uint)bVar8 *
                                                                                    auVar43._12_4_ |
                                                                                    (uint)!bVar8 *
                                                                                    auVar42._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar7 * auVar43._8_4_ |
                                                  (uint)!bVar7 * auVar42._8_4_,
                                                  CONCAT44((uint)bVar36 * auVar43._4_4_ |
                                                           (uint)!bVar36 * auVar42._4_4_,
                                                           auVar42._0_4_))))))));
            } while (bVar27 != 0);
            lVar25 = (ulong)(uint)POPCOUNT((uint)bVar29) + 3;
            while( true ) {
              auVar43 = auVar101._0_32_;
              auVar42 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
              uVar35 = auVar42._0_8_;
              bVar36 = lVar25 == 0;
              lVar25 = lVar25 + -1;
              if (bVar36) break;
              *local_2878 = uVar35;
              auVar42 = vpermd_avx2(auVar43,auVar39);
              *(int *)(local_2878 + 1) = auVar42._0_4_;
              auVar42 = valignd_avx512vl(auVar43,auVar43,1);
              auVar101 = ZEXT3264(auVar42);
              local_2878 = local_2878 + 2;
            }
            auVar101 = ZEXT3264(local_2740);
            auVar102 = ZEXT3264(local_2760);
            auVar103 = ZEXT3264(local_2780);
            auVar104 = ZEXT3264(local_27a0);
            auVar105 = ZEXT3264(local_27c0);
            auVar106 = ZEXT3264(local_27e0);
            goto LAB_01db1670;
          }
          auVar45 = vpermi2q_avx512vl(auVar47,auVar40,auVar41);
          uVar35 = auVar45._0_8_;
          auVar45 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
          *local_2878 = auVar45._0_8_;
          auVar43 = vpermd_avx2(auVar43,auVar39);
          *(int *)(local_2878 + 1) = auVar43._0_4_;
          auVar43 = vpermt2q_avx512vl(auVar40,auVar59,auVar41);
          local_2878[2] = auVar43._0_8_;
          auVar43 = vpermd_avx2(auVar59,auVar39);
          *(int *)(local_2878 + 3) = auVar43._0_4_;
          auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
          local_2878[4] = auVar40._0_8_;
          lVar25 = 0x28;
          lStack_2888 = 0x30;
        }
      }
      auVar39 = vpermd_avx2(auVar42,auVar39);
      *(int *)((long)local_2878 + lVar25) = auVar39._0_4_;
      local_2878 = (ulong *)((long)local_2878 + lStack_2888);
    }
  } while( true );
  local_2828 = (ulong)((uint)uVar35 & 0xf) - 8;
  uVar35 = uVar35 & 0xfffffffffffffff0;
  for (local_2818 = 0; local_2818 != local_2828; local_2818 = local_2818 + 1) {
    lVar26 = local_2818 * 0xe0;
    lVar25 = uVar35 + 0xd0 + lVar26;
    local_26c0 = *(undefined8 *)(lVar25 + 0x10);
    uStack_26b8 = *(undefined8 *)(lVar25 + 0x18);
    lVar25 = uVar35 + 0xc0 + lVar26;
    local_2580 = *(undefined8 *)(lVar25 + 0x10);
    uStack_2578 = *(undefined8 *)(lVar25 + 0x18);
    uStack_2570 = local_2580;
    uStack_2568 = uStack_2578;
    uStack_26b0 = local_26c0;
    uStack_26a8 = uStack_26b8;
    auVar39._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x60 + lVar26);
    auVar39._0_16_ = *(undefined1 (*) [16])(uVar35 + lVar26);
    auVar48._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x70 + lVar26);
    auVar48._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x10 + lVar26);
    auVar49._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x80 + lVar26);
    auVar49._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x20 + lVar26);
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0x30 + lVar26);
    auVar51._16_16_ = auVar4;
    auVar51._0_16_ = auVar4;
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0x40 + lVar26);
    auVar52._16_16_ = auVar4;
    auVar52._0_16_ = auVar4;
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0x50 + lVar26);
    auVar53._16_16_ = auVar4;
    auVar53._0_16_ = auVar4;
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0x90 + lVar26);
    auVar54._16_16_ = auVar4;
    auVar54._0_16_ = auVar4;
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0xa0 + lVar26);
    auVar55._16_16_ = auVar4;
    auVar55._0_16_ = auVar4;
    auVar4 = *(undefined1 (*) [16])(uVar35 + 0xb0 + lVar26);
    auVar56._16_16_ = auVar4;
    auVar56._0_16_ = auVar4;
    uVar74 = *(undefined4 *)(ray + k * 4);
    auVar57._4_4_ = uVar74;
    auVar57._0_4_ = uVar74;
    auVar57._8_4_ = uVar74;
    auVar57._12_4_ = uVar74;
    auVar57._16_4_ = uVar74;
    auVar57._20_4_ = uVar74;
    auVar57._24_4_ = uVar74;
    auVar57._28_4_ = uVar74;
    auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
    auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar74 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar71._4_4_ = uVar74;
    auVar71._0_4_ = uVar74;
    auVar71._8_4_ = uVar74;
    auVar71._12_4_ = uVar74;
    auVar71._16_4_ = uVar74;
    auVar71._20_4_ = uVar74;
    auVar71._24_4_ = uVar74;
    auVar71._28_4_ = uVar74;
    uVar74 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar73._4_4_ = uVar74;
    auVar73._0_4_ = uVar74;
    auVar73._8_4_ = uVar74;
    auVar73._12_4_ = uVar74;
    auVar73._16_4_ = uVar74;
    auVar73._20_4_ = uVar74;
    auVar73._24_4_ = uVar74;
    auVar73._28_4_ = uVar74;
    fVar76 = *(float *)(ray + k * 4 + 0x60);
    auVar77._4_4_ = fVar76;
    auVar77._0_4_ = fVar76;
    auVar77._8_4_ = fVar76;
    auVar77._12_4_ = fVar76;
    auVar77._16_4_ = fVar76;
    auVar77._20_4_ = fVar76;
    auVar77._24_4_ = fVar76;
    auVar77._28_4_ = fVar76;
    auVar39 = vsubps_avx(auVar39,auVar57);
    auVar48 = vsubps_avx512vl(auVar48,auVar41);
    auVar49 = vsubps_avx512vl(auVar49,auVar42);
    auVar43 = vsubps_avx512vl(auVar51,auVar57);
    auVar45 = vsubps_avx512vl(auVar52,auVar41);
    auVar46 = vsubps_avx512vl(auVar53,auVar42);
    auVar40 = vsubps_avx(auVar54,auVar57);
    auVar50 = vsubps_avx512vl(auVar55,auVar41);
    auVar51 = vsubps_avx512vl(auVar56,auVar42);
    auVar41 = vsubps_avx(auVar40,auVar39);
    auVar52 = vsubps_avx512vl(auVar50,auVar48);
    auVar42 = vsubps_avx(auVar51,auVar49);
    auVar53 = vsubps_avx512vl(auVar39,auVar43);
    auVar54 = vsubps_avx512vl(auVar48,auVar45);
    auVar55 = vsubps_avx512vl(auVar49,auVar46);
    auVar56 = vsubps_avx512vl(auVar43,auVar40);
    auVar57 = vsubps_avx512vl(auVar45,auVar50);
    auVar58 = vsubps_avx512vl(auVar46,auVar51);
    auVar68._0_4_ = auVar40._0_4_ + auVar39._0_4_;
    auVar68._4_4_ = auVar40._4_4_ + auVar39._4_4_;
    auVar68._8_4_ = auVar40._8_4_ + auVar39._8_4_;
    auVar68._12_4_ = auVar40._12_4_ + auVar39._12_4_;
    auVar68._16_4_ = auVar40._16_4_ + auVar39._16_4_;
    auVar68._20_4_ = auVar40._20_4_ + auVar39._20_4_;
    auVar68._24_4_ = auVar40._24_4_ + auVar39._24_4_;
    auVar68._28_4_ = auVar40._28_4_ + auVar39._28_4_;
    auVar47 = vaddps_avx512vl(auVar50,auVar48);
    auVar59 = vaddps_avx512vl(auVar51,auVar49);
    auVar60 = vmulps_avx512vl(auVar47,auVar42);
    auVar60 = vfmsub231ps_avx512vl(auVar60,auVar52,auVar59);
    auVar59 = vmulps_avx512vl(auVar59,auVar41);
    auVar61 = vfmsub231ps_avx512vl(auVar59,auVar42,auVar68);
    auVar59._4_4_ = auVar52._4_4_ * auVar68._4_4_;
    auVar59._0_4_ = auVar52._0_4_ * auVar68._0_4_;
    auVar59._8_4_ = auVar52._8_4_ * auVar68._8_4_;
    auVar59._12_4_ = auVar52._12_4_ * auVar68._12_4_;
    auVar59._16_4_ = auVar52._16_4_ * auVar68._16_4_;
    auVar59._20_4_ = auVar52._20_4_ * auVar68._20_4_;
    auVar59._24_4_ = auVar52._24_4_ * auVar68._24_4_;
    auVar59._28_4_ = auVar68._28_4_;
    auVar4 = vfmsub231ps_fma(auVar59,auVar41,auVar47);
    auVar69._0_4_ = fVar76 * auVar4._0_4_;
    auVar69._4_4_ = fVar76 * auVar4._4_4_;
    auVar69._8_4_ = fVar76 * auVar4._8_4_;
    auVar69._12_4_ = fVar76 * auVar4._12_4_;
    auVar69._16_4_ = fVar76 * 0.0;
    auVar69._20_4_ = fVar76 * 0.0;
    auVar69._24_4_ = fVar76 * 0.0;
    auVar69._28_4_ = 0;
    auVar59 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar61);
    local_2560 = vfmadd231ps_avx512vl(auVar59,auVar71,auVar60);
    auVar59 = vaddps_avx512vl(auVar39,auVar43);
    auVar47 = vaddps_avx512vl(auVar48,auVar45);
    auVar60 = vaddps_avx512vl(auVar49,auVar46);
    auVar61 = vmulps_avx512vl(auVar47,auVar55);
    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar54,auVar60);
    auVar60 = vmulps_avx512vl(auVar60,auVar53);
    auVar60 = vfmsub231ps_avx512vl(auVar60,auVar55,auVar59);
    auVar59 = vmulps_avx512vl(auVar59,auVar54);
    auVar59 = vfmsub231ps_avx512vl(auVar59,auVar53,auVar47);
    auVar47._4_4_ = fVar76 * auVar59._4_4_;
    auVar47._0_4_ = fVar76 * auVar59._0_4_;
    auVar47._8_4_ = fVar76 * auVar59._8_4_;
    auVar47._12_4_ = fVar76 * auVar59._12_4_;
    auVar47._16_4_ = fVar76 * auVar59._16_4_;
    auVar47._20_4_ = fVar76 * auVar59._20_4_;
    auVar47._24_4_ = fVar76 * auVar59._24_4_;
    auVar47._28_4_ = auVar59._28_4_;
    auVar59 = vfmadd231ps_avx512vl(auVar47,auVar73,auVar60);
    local_2540 = vfmadd231ps_avx512vl(auVar59,auVar71,auVar61);
    auVar40 = vaddps_avx512vl(auVar43,auVar40);
    auVar43 = vaddps_avx512vl(auVar45,auVar50);
    auVar45 = vaddps_avx512vl(auVar46,auVar51);
    auVar59 = vmulps_avx512vl(auVar43,auVar58);
    auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar45);
    auVar46._4_4_ = auVar45._4_4_ * auVar56._4_4_;
    auVar46._0_4_ = auVar45._0_4_ * auVar56._0_4_;
    auVar46._8_4_ = auVar45._8_4_ * auVar56._8_4_;
    auVar46._12_4_ = auVar45._12_4_ * auVar56._12_4_;
    auVar46._16_4_ = auVar45._16_4_ * auVar56._16_4_;
    auVar46._20_4_ = auVar45._20_4_ * auVar56._20_4_;
    auVar46._24_4_ = auVar45._24_4_ * auVar56._24_4_;
    auVar46._28_4_ = auVar45._28_4_;
    auVar4 = vfmsub231ps_fma(auVar46,auVar58,auVar40);
    auVar50._4_4_ = auVar40._4_4_ * auVar57._4_4_;
    auVar50._0_4_ = auVar40._0_4_ * auVar57._0_4_;
    auVar50._8_4_ = auVar40._8_4_ * auVar57._8_4_;
    auVar50._12_4_ = auVar40._12_4_ * auVar57._12_4_;
    auVar50._16_4_ = auVar40._16_4_ * auVar57._16_4_;
    auVar50._20_4_ = auVar40._20_4_ * auVar57._20_4_;
    auVar50._24_4_ = auVar40._24_4_ * auVar57._24_4_;
    auVar50._28_4_ = auVar40._28_4_;
    auVar40 = vfmsub231ps_avx512vl(auVar50,auVar56,auVar43);
    auVar40 = vmulps_avx512vl(auVar40,auVar77);
    auVar40 = vfmadd231ps_avx512vl(auVar40,auVar73,ZEXT1632(auVar4));
    auVar59 = vfmadd231ps_avx512vl(auVar40,auVar71,auVar59);
    auVar60._0_4_ = local_2560._0_4_ + local_2540._0_4_;
    auVar60._4_4_ = local_2560._4_4_ + local_2540._4_4_;
    auVar60._8_4_ = local_2560._8_4_ + local_2540._8_4_;
    auVar60._12_4_ = local_2560._12_4_ + local_2540._12_4_;
    auVar60._16_4_ = local_2560._16_4_ + local_2540._16_4_;
    auVar60._20_4_ = local_2560._20_4_ + local_2540._20_4_;
    auVar60._24_4_ = local_2560._24_4_ + local_2540._24_4_;
    auVar60._28_4_ = local_2560._28_4_ + local_2540._28_4_;
    local_2520 = vaddps_avx512vl(auVar59,auVar60);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40._16_4_ = 0x7fffffff;
    auVar40._20_4_ = 0x7fffffff;
    auVar40._24_4_ = 0x7fffffff;
    auVar40._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar40);
    auVar43._8_4_ = 0x34000000;
    auVar43._0_8_ = 0x3400000034000000;
    auVar43._12_4_ = 0x34000000;
    auVar43._16_4_ = 0x34000000;
    auVar43._20_4_ = 0x34000000;
    auVar43._24_4_ = 0x34000000;
    auVar43._28_4_ = 0x34000000;
    auVar40 = vmulps_avx512vl(local_2520,auVar43);
    auVar43 = vminps_avx512vl(local_2560,local_2540);
    auVar43 = vminps_avx512vl(auVar43,auVar59);
    auVar45._8_4_ = 0x80000000;
    auVar45._0_8_ = 0x8000000080000000;
    auVar45._12_4_ = 0x80000000;
    auVar45._16_4_ = 0x80000000;
    auVar45._20_4_ = 0x80000000;
    auVar45._24_4_ = 0x80000000;
    auVar45._28_4_ = 0x80000000;
    auVar45 = vxorps_avx512vl(auVar40,auVar45);
    uVar14 = vcmpps_avx512vl(auVar43,auVar45,5);
    auVar43 = vmaxps_avx512vl(local_2560,local_2540);
    auVar43 = vmaxps_avx512vl(auVar43,auVar59);
    uVar12 = vcmpps_avx512vl(auVar43,auVar40,2);
    bVar29 = (byte)uVar14 | (byte)uVar12;
    if (bVar29 != 0) {
      auVar40 = vmulps_avx512vl(auVar54,auVar42);
      auVar43 = vmulps_avx512vl(auVar41,auVar55);
      auVar45 = vmulps_avx512vl(auVar53,auVar52);
      auVar59 = vmulps_avx512vl(auVar57,auVar55);
      auVar47 = vmulps_avx512vl(auVar53,auVar58);
      auVar46 = vmulps_avx512vl(auVar56,auVar54);
      auVar50 = vfmsub213ps_avx512vl(auVar52,auVar55,auVar40);
      auVar42 = vfmsub213ps_avx512vl(auVar42,auVar53,auVar43);
      auVar41 = vfmsub213ps_avx512vl(auVar41,auVar54,auVar45);
      auVar51 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar59);
      auVar52 = vfmsub213ps_avx512vl(auVar56,auVar55,auVar47);
      auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar46);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar40,auVar54);
      vandps_avx512vl(auVar59,auVar54);
      uVar37 = vcmpps_avx512vl(auVar54,auVar54,1);
      vandps_avx512vl(auVar43,auVar54);
      vandps_avx512vl(auVar47,auVar54);
      uVar38 = vcmpps_avx512vl(auVar54,auVar54,1);
      vandps_avx512vl(auVar45,auVar54);
      vandps_avx512vl(auVar46,auVar54);
      uVar13 = vcmpps_avx512vl(auVar54,auVar54,1);
      bVar36 = (bool)((byte)uVar37 & 1);
      local_2500._0_4_ = (float)((uint)bVar36 * auVar50._0_4_ | (uint)!bVar36 * auVar51._0_4_);
      bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
      local_2500._4_4_ = (float)((uint)bVar36 * auVar50._4_4_ | (uint)!bVar36 * auVar51._4_4_);
      bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
      local_2500._8_4_ = (float)((uint)bVar36 * auVar50._8_4_ | (uint)!bVar36 * auVar51._8_4_);
      bVar36 = (bool)((byte)(uVar37 >> 3) & 1);
      local_2500._12_4_ = (float)((uint)bVar36 * auVar50._12_4_ | (uint)!bVar36 * auVar51._12_4_);
      bVar36 = (bool)((byte)(uVar37 >> 4) & 1);
      local_2500._16_4_ = (float)((uint)bVar36 * auVar50._16_4_ | (uint)!bVar36 * auVar51._16_4_);
      bVar36 = (bool)((byte)(uVar37 >> 5) & 1);
      local_2500._20_4_ = (float)((uint)bVar36 * auVar50._20_4_ | (uint)!bVar36 * auVar51._20_4_);
      bVar36 = (bool)((byte)(uVar37 >> 6) & 1);
      local_2500._24_4_ = (float)((uint)bVar36 * auVar50._24_4_ | (uint)!bVar36 * auVar51._24_4_);
      bVar36 = SUB81(uVar37 >> 7,0);
      local_2500._28_4_ = (uint)bVar36 * auVar50._28_4_ | (uint)!bVar36 * auVar51._28_4_;
      bVar36 = (bool)((byte)uVar38 & 1);
      local_24e0._0_4_ = (float)((uint)bVar36 * auVar42._0_4_ | (uint)!bVar36 * auVar52._0_4_);
      bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
      local_24e0._4_4_ = (float)((uint)bVar36 * auVar42._4_4_ | (uint)!bVar36 * auVar52._4_4_);
      bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
      local_24e0._8_4_ = (float)((uint)bVar36 * auVar42._8_4_ | (uint)!bVar36 * auVar52._8_4_);
      bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
      local_24e0._12_4_ = (float)((uint)bVar36 * auVar42._12_4_ | (uint)!bVar36 * auVar52._12_4_);
      bVar36 = (bool)((byte)(uVar38 >> 4) & 1);
      local_24e0._16_4_ = (float)((uint)bVar36 * auVar42._16_4_ | (uint)!bVar36 * auVar52._16_4_);
      bVar36 = (bool)((byte)(uVar38 >> 5) & 1);
      local_24e0._20_4_ = (float)((uint)bVar36 * auVar42._20_4_ | (uint)!bVar36 * auVar52._20_4_);
      bVar36 = (bool)((byte)(uVar38 >> 6) & 1);
      local_24e0._24_4_ = (float)((uint)bVar36 * auVar42._24_4_ | (uint)!bVar36 * auVar52._24_4_);
      bVar36 = SUB81(uVar38 >> 7,0);
      local_24e0._28_4_ = (uint)bVar36 * auVar42._28_4_ | (uint)!bVar36 * auVar52._28_4_;
      bVar36 = (bool)((byte)uVar13 & 1);
      local_24c0 = (float)((uint)bVar36 * auVar41._0_4_ | (uint)!bVar36 * auVar53._0_4_);
      bVar36 = (bool)((byte)(uVar13 >> 1) & 1);
      fStack_24bc = (float)((uint)bVar36 * auVar41._4_4_ | (uint)!bVar36 * auVar53._4_4_);
      bVar36 = (bool)((byte)(uVar13 >> 2) & 1);
      fStack_24b8 = (float)((uint)bVar36 * auVar41._8_4_ | (uint)!bVar36 * auVar53._8_4_);
      bVar36 = (bool)((byte)(uVar13 >> 3) & 1);
      fStack_24b4 = (float)((uint)bVar36 * auVar41._12_4_ | (uint)!bVar36 * auVar53._12_4_);
      bVar36 = (bool)((byte)(uVar13 >> 4) & 1);
      fStack_24b0 = (float)((uint)bVar36 * auVar41._16_4_ | (uint)!bVar36 * auVar53._16_4_);
      bVar36 = (bool)((byte)(uVar13 >> 5) & 1);
      fStack_24ac = (float)((uint)bVar36 * auVar41._20_4_ | (uint)!bVar36 * auVar53._20_4_);
      bVar36 = (bool)((byte)(uVar13 >> 6) & 1);
      fStack_24a8 = (float)((uint)bVar36 * auVar41._24_4_ | (uint)!bVar36 * auVar53._24_4_);
      bVar36 = SUB81(uVar13 >> 7,0);
      uStack_24a4 = (uint)bVar36 * auVar41._28_4_ | (uint)!bVar36 * auVar53._28_4_;
      auVar58._4_4_ = fVar76 * fStack_24bc;
      auVar58._0_4_ = fVar76 * local_24c0;
      auVar58._8_4_ = fVar76 * fStack_24b8;
      auVar58._12_4_ = fVar76 * fStack_24b4;
      auVar58._16_4_ = fVar76 * fStack_24b0;
      auVar58._20_4_ = fVar76 * fStack_24ac;
      auVar58._24_4_ = fVar76 * fStack_24a8;
      auVar58._28_4_ = fVar76;
      auVar4 = vfmadd213ps_fma(auVar73,local_24e0,auVar58);
      auVar4 = vfmadd213ps_fma(auVar71,local_2500,ZEXT1632(auVar4));
      auVar43 = ZEXT1632(CONCAT412(auVar4._12_4_ + auVar4._12_4_,
                                   CONCAT48(auVar4._8_4_ + auVar4._8_4_,
                                            CONCAT44(auVar4._4_4_ + auVar4._4_4_,
                                                     auVar4._0_4_ + auVar4._0_4_))));
      auVar61._0_4_ = auVar49._0_4_ * local_24c0;
      auVar61._4_4_ = auVar49._4_4_ * fStack_24bc;
      auVar61._8_4_ = auVar49._8_4_ * fStack_24b8;
      auVar61._12_4_ = auVar49._12_4_ * fStack_24b4;
      auVar61._16_4_ = auVar49._16_4_ * fStack_24b0;
      auVar61._20_4_ = auVar49._20_4_ * fStack_24ac;
      auVar61._24_4_ = auVar49._24_4_ * fStack_24a8;
      auVar61._28_4_ = 0;
      auVar4 = vfmadd213ps_fma(auVar48,local_24e0,auVar61);
      auVar16 = vfmadd213ps_fma(auVar39,local_2500,ZEXT1632(auVar4));
      auVar39 = vrcp14ps_avx512vl(auVar43);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar41._16_4_ = 0x3f800000;
      auVar41._20_4_ = 0x3f800000;
      auVar41._24_4_ = 0x3f800000;
      auVar41._28_4_ = 0x3f800000;
      auVar40 = vfnmadd213ps_avx512vl(auVar39,auVar43,auVar41);
      auVar4 = vfmadd132ps_fma(auVar40,auVar39,auVar39);
      uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar75._4_4_ = uVar74;
      auVar75._0_4_ = uVar74;
      auVar75._8_4_ = uVar74;
      auVar75._12_4_ = uVar74;
      auVar75._16_4_ = uVar74;
      auVar75._20_4_ = uVar74;
      auVar75._24_4_ = uVar74;
      auVar75._28_4_ = uVar74;
      auVar98 = ZEXT3264(auVar75);
      local_2440 = ZEXT1632(CONCAT412(auVar4._12_4_ * (auVar16._12_4_ + auVar16._12_4_),
                                      CONCAT48(auVar4._8_4_ * (auVar16._8_4_ + auVar16._8_4_),
                                               CONCAT44(auVar4._4_4_ *
                                                        (auVar16._4_4_ + auVar16._4_4_),
                                                        auVar4._0_4_ *
                                                        (auVar16._0_4_ + auVar16._0_4_)))));
      auVar67 = ZEXT3264(local_2440);
      uVar14 = vcmpps_avx512vl(local_2440,auVar75,2);
      uVar74 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar42._4_4_ = uVar74;
      auVar42._0_4_ = uVar74;
      auVar42._8_4_ = uVar74;
      auVar42._12_4_ = uVar74;
      auVar42._16_4_ = uVar74;
      auVar42._20_4_ = uVar74;
      auVar42._24_4_ = uVar74;
      auVar42._28_4_ = uVar74;
      uVar12 = vcmpps_avx512vl(local_2440,auVar42,0xd);
      bVar29 = (byte)uVar14 & (byte)uVar12 & bVar29;
      if (bVar29 != 0) {
        uVar37 = vcmpps_avx512vl(auVar43,_DAT_01f7b000,4);
        uVar37 = bVar29 & uVar37;
        local_24a0 = (byte)uVar37;
        if (local_24a0 != 0) {
          local_23c0 = 0xf0;
          local_2820 = context->scene;
          auVar17._8_4_ = 0x219392ef;
          auVar17._0_8_ = 0x219392ef219392ef;
          auVar17._12_4_ = 0x219392ef;
          auVar17._16_4_ = 0x219392ef;
          auVar17._20_4_ = 0x219392ef;
          auVar17._24_4_ = 0x219392ef;
          auVar17._28_4_ = 0x219392ef;
          uVar38 = vcmpps_avx512vl(local_2520,auVar17,5);
          auVar40 = vrcp14ps_avx512vl(local_2520);
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar72._16_4_ = 0x3f800000;
          auVar72._20_4_ = 0x3f800000;
          auVar72._24_4_ = 0x3f800000;
          auVar72._28_4_ = 0x3f800000;
          auVar4 = vfnmadd213ps_fma(local_2520,auVar40,auVar72);
          auVar39 = vfmadd132ps_avx512vl(ZEXT1632(auVar4),auVar40,auVar40);
          fVar84 = (float)((uint)((byte)uVar38 & 1) * auVar39._0_4_);
          fVar76 = (float)((uint)((byte)(uVar38 >> 1) & 1) * auVar39._4_4_);
          fVar81 = (float)((uint)((byte)(uVar38 >> 2) & 1) * auVar39._8_4_);
          fVar80 = (float)((uint)((byte)(uVar38 >> 3) & 1) * auVar39._12_4_);
          fVar79 = (float)((uint)((byte)(uVar38 >> 4) & 1) * auVar39._16_4_);
          fVar78 = (float)((uint)((byte)(uVar38 >> 5) & 1) * auVar39._20_4_);
          fVar91 = (float)((uint)((byte)(uVar38 >> 6) & 1) * auVar39._24_4_);
          auVar21._4_4_ = fVar76 * local_2560._4_4_;
          auVar21._0_4_ = fVar84 * local_2560._0_4_;
          auVar21._8_4_ = fVar81 * local_2560._8_4_;
          auVar21._12_4_ = fVar80 * local_2560._12_4_;
          auVar21._16_4_ = fVar79 * local_2560._16_4_;
          auVar21._20_4_ = fVar78 * local_2560._20_4_;
          auVar21._24_4_ = fVar91 * local_2560._24_4_;
          auVar21._28_4_ = local_2560._28_4_;
          auVar39 = vminps_avx(auVar21,auVar72);
          auVar22._4_4_ = fVar76 * local_2540._4_4_;
          auVar22._0_4_ = fVar84 * local_2540._0_4_;
          auVar22._8_4_ = fVar81 * local_2540._8_4_;
          auVar22._12_4_ = fVar80 * local_2540._12_4_;
          auVar22._16_4_ = fVar79 * local_2540._16_4_;
          auVar22._20_4_ = fVar78 * local_2540._20_4_;
          auVar22._24_4_ = fVar91 * local_2540._24_4_;
          auVar22._28_4_ = auVar40._28_4_;
          auVar40 = vminps_avx(auVar22,auVar72);
          auVar41 = vsubps_avx(auVar72,auVar39);
          auVar42 = vsubps_avx(auVar72,auVar40);
          local_2460 = vblendps_avx(auVar40,auVar41,0xf0);
          local_2480 = vblendps_avx(auVar39,auVar42,0xf0);
          fVar76 = (float)DAT_01fbac00;
          fVar84 = DAT_01fbac00._4_4_;
          fVar91 = DAT_01fbac00._8_4_;
          fVar78 = DAT_01fbac00._12_4_;
          fVar79 = DAT_01fbac00._16_4_;
          fVar80 = DAT_01fbac00._20_4_;
          fVar81 = DAT_01fbac00._24_4_;
          local_2420[0] = local_2500._0_4_ * fVar76;
          local_2420[1] = local_2500._4_4_ * fVar84;
          local_2420[2] = local_2500._8_4_ * fVar91;
          local_2420[3] = local_2500._12_4_ * fVar78;
          fStack_2410 = local_2500._16_4_ * fVar79;
          fStack_240c = local_2500._20_4_ * fVar80;
          fStack_2408 = local_2500._24_4_ * fVar81;
          uStack_2404 = local_2500._28_4_;
          local_2400[0] = local_24e0._0_4_ * fVar76;
          local_2400[1] = local_24e0._4_4_ * fVar84;
          local_2400[2] = local_24e0._8_4_ * fVar91;
          local_2400[3] = local_24e0._12_4_ * fVar78;
          fStack_23f0 = local_24e0._16_4_ * fVar79;
          fStack_23ec = local_24e0._20_4_ * fVar80;
          fStack_23e8 = local_24e0._24_4_ * fVar81;
          uStack_23e4 = local_24e0._28_4_;
          local_23e0[0] = local_24c0 * fVar76;
          local_23e0[1] = fStack_24bc * fVar84;
          local_23e0[2] = fStack_24b8 * fVar91;
          local_23e0[3] = fStack_24b4 * fVar78;
          fStack_23d0 = fStack_24b0 * fVar79;
          fStack_23cc = fStack_24ac * fVar80;
          fStack_23c8 = fStack_24a8 * fVar81;
          uStack_23c4 = uStack_24a4;
          auVar64._8_4_ = 0x7f800000;
          auVar64._0_8_ = 0x7f8000007f800000;
          auVar64._12_4_ = 0x7f800000;
          auVar64._16_4_ = 0x7f800000;
          auVar64._20_4_ = 0x7f800000;
          auVar64._24_4_ = 0x7f800000;
          auVar64._28_4_ = 0x7f800000;
          auVar39 = vblendmps_avx512vl(auVar64,local_2440);
          auVar62._0_4_ =
               (uint)(local_24a0 & 1) * auVar39._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar62._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar62._16_4_ = (uint)bVar36 * auVar39._16_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar62._20_4_ = (uint)bVar36 * auVar39._20_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar62._24_4_ = (uint)bVar36 * auVar39._24_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = SUB81(uVar37 >> 7,0);
          auVar62._28_4_ = (uint)bVar36 * auVar39._28_4_ | (uint)!bVar36 * 0x7f800000;
          auVar39 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar39 = vminps_avx(auVar62,auVar39);
          auVar40 = vshufpd_avx(auVar39,auVar39,5);
          auVar39 = vminps_avx(auVar39,auVar40);
          auVar40 = vpermpd_avx2(auVar39,0x4e);
          auVar39 = vminps_avx(auVar39,auVar40);
          uVar14 = vcmpps_avx512vl(auVar62,auVar39,0);
          uVar30 = (uint)uVar37;
          if (((byte)uVar14 & local_24a0) != 0) {
            uVar30 = (uint)((byte)uVar14 & local_24a0);
          }
          uVar28 = 0;
          for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
            uVar28 = uVar28 + 1;
          }
          do {
            uVar32 = uVar28 & 0xff;
            uVar30 = *(uint *)((long)&local_2580 + (ulong)uVar32 * 4);
            pGVar5 = (local_2820->geometries).items[uVar30].ptr;
            if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar37 = (ulong)(byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar37);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar37 = (ulong)(uVar32 << 2);
                uVar74 = *(undefined4 *)(local_2480 + uVar37);
                uVar3 = *(undefined4 *)(local_2460 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_23e0 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar74;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_26c0 + uVar37);
                *(uint *)(ray + k * 4 + 0x120) = uVar30;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              uVar38 = (ulong)(uVar32 * 4);
              uVar74 = *(undefined4 *)(local_2480 + uVar38);
              local_2660._4_4_ = uVar74;
              local_2660._0_4_ = uVar74;
              local_2660._8_4_ = uVar74;
              local_2660._12_4_ = uVar74;
              local_2650 = *(undefined4 *)(local_2460 + uVar38);
              local_2630 = vpbroadcastd_avx512vl();
              uVar74 = *(undefined4 *)((long)&local_26c0 + uVar38);
              local_2640._4_4_ = uVar74;
              local_2640._0_4_ = uVar74;
              local_2640._8_4_ = uVar74;
              local_2640._12_4_ = uVar74;
              uVar74 = *(undefined4 *)((long)local_2420 + uVar38);
              uVar3 = *(undefined4 *)((long)local_2400 + uVar38);
              local_2680._4_4_ = uVar3;
              local_2680._0_4_ = uVar3;
              local_2680._8_4_ = uVar3;
              local_2680._12_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)local_23e0 + uVar38);
              local_2670._4_4_ = uVar3;
              local_2670._0_4_ = uVar3;
              local_2670._8_4_ = uVar3;
              local_2670._12_4_ = uVar3;
              local_2690[0] = (RTCHitN)(char)uVar74;
              local_2690[1] = (RTCHitN)(char)((uint)uVar74 >> 8);
              local_2690[2] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
              local_2690[3] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
              local_2690[4] = (RTCHitN)(char)uVar74;
              local_2690[5] = (RTCHitN)(char)((uint)uVar74 >> 8);
              local_2690[6] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
              local_2690[7] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
              local_2690[8] = (RTCHitN)(char)uVar74;
              local_2690[9] = (RTCHitN)(char)((uint)uVar74 >> 8);
              local_2690[10] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
              local_2690[0xb] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
              local_2690[0xc] = (RTCHitN)(char)uVar74;
              local_2690[0xd] = (RTCHitN)(char)((uint)uVar74 >> 8);
              local_2690[0xe] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
              local_2690[0xf] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
              uStack_264c = local_2650;
              uStack_2648 = local_2650;
              uStack_2644 = local_2650;
              vpcmpeqd_avx2(ZEXT1632(local_2660),ZEXT1632(local_2660));
              uStack_261c = context->user->instID[0];
              local_2620 = uStack_261c;
              uStack_2618 = uStack_261c;
              uStack_2614 = uStack_261c;
              uStack_2610 = context->user->instPrimID[0];
              uStack_260c = uStack_2610;
              uStack_2608 = uStack_2610;
              uStack_2604 = uStack_2610;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar38);
              local_2840 = local_2710;
              local_2810.valid = (int *)local_2840;
              local_2810.geometryUserPtr = pGVar5->userPtr;
              local_2810.context = context->user;
              local_2810.hit = local_2690;
              local_2810.N = 4;
              local_26e0 = auVar67._0_32_;
              local_2700 = auVar98._0_32_;
              local_2810.ray = (RTCRayN *)ray;
              if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->intersectionFilterN)(&local_2810);
                auVar98 = ZEXT3264(local_2700);
                auVar67 = ZEXT3264(local_26e0);
                auVar106 = ZEXT3264(local_27e0);
                auVar105 = ZEXT3264(local_27c0);
                auVar104 = ZEXT3264(local_27a0);
                auVar103 = ZEXT3264(local_2780);
                auVar102 = ZEXT3264(local_2760);
                auVar101 = ZEXT3264(local_2740);
              }
              uVar38 = vptestmd_avx512vl(local_2840,local_2840);
              if ((uVar38 & 0xf) == 0) {
LAB_01db22a7:
                *(int *)(ray + k * 4 + 0x80) = auVar98._0_4_;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var6)(&local_2810);
                  auVar98 = ZEXT3264(local_2700);
                  auVar67 = ZEXT3264(local_26e0);
                  auVar106 = ZEXT3264(local_27e0);
                  auVar105 = ZEXT3264(local_27c0);
                  auVar104 = ZEXT3264(local_27a0);
                  auVar103 = ZEXT3264(local_2780);
                  auVar102 = ZEXT3264(local_2760);
                  auVar101 = ZEXT3264(local_2740);
                }
                uVar38 = vptestmd_avx512vl(local_2840,local_2840);
                uVar38 = uVar38 & 0xf;
                bVar29 = (byte)uVar38;
                if (bVar29 == 0) goto LAB_01db22a7;
                iVar2 = *(int *)(local_2810.hit + 4);
                iVar23 = *(int *)(local_2810.hit + 8);
                iVar24 = *(int *)(local_2810.hit + 0xc);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar8 = SUB81(uVar38 >> 3,0);
                *(uint *)(local_2810.ray + 0xc0) =
                     (uint)(bVar29 & 1) * *(int *)local_2810.hit |
                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_2810.ray + 0xc0);
                *(uint *)(local_2810.ray + 0xc4) =
                     (uint)bVar36 * iVar2 | (uint)!bVar36 * *(int *)(local_2810.ray + 0xc4);
                *(uint *)(local_2810.ray + 200) =
                     (uint)bVar7 * iVar23 | (uint)!bVar7 * *(int *)(local_2810.ray + 200);
                *(uint *)(local_2810.ray + 0xcc) =
                     (uint)bVar8 * iVar24 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xcc);
                iVar2 = *(int *)(local_2810.hit + 0x14);
                iVar23 = *(int *)(local_2810.hit + 0x18);
                iVar24 = *(int *)(local_2810.hit + 0x1c);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar8 = SUB81(uVar38 >> 3,0);
                *(uint *)(local_2810.ray + 0xd0) =
                     (uint)(bVar29 & 1) * *(int *)(local_2810.hit + 0x10) |
                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_2810.ray + 0xd0);
                *(uint *)(local_2810.ray + 0xd4) =
                     (uint)bVar36 * iVar2 | (uint)!bVar36 * *(int *)(local_2810.ray + 0xd4);
                *(uint *)(local_2810.ray + 0xd8) =
                     (uint)bVar7 * iVar23 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xd8);
                *(uint *)(local_2810.ray + 0xdc) =
                     (uint)bVar8 * iVar24 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xdc);
                iVar2 = *(int *)(local_2810.hit + 0x24);
                iVar23 = *(int *)(local_2810.hit + 0x28);
                iVar24 = *(int *)(local_2810.hit + 0x2c);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar8 = SUB81(uVar38 >> 3,0);
                *(uint *)(local_2810.ray + 0xe0) =
                     (uint)(bVar29 & 1) * *(int *)(local_2810.hit + 0x20) |
                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_2810.ray + 0xe0);
                *(uint *)(local_2810.ray + 0xe4) =
                     (uint)bVar36 * iVar2 | (uint)!bVar36 * *(int *)(local_2810.ray + 0xe4);
                *(uint *)(local_2810.ray + 0xe8) =
                     (uint)bVar7 * iVar23 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xe8);
                *(uint *)(local_2810.ray + 0xec) =
                     (uint)bVar8 * iVar24 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xec);
                iVar2 = *(int *)(local_2810.hit + 0x34);
                iVar23 = *(int *)(local_2810.hit + 0x38);
                iVar24 = *(int *)(local_2810.hit + 0x3c);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar8 = SUB81(uVar38 >> 3,0);
                *(uint *)(local_2810.ray + 0xf0) =
                     (uint)(bVar29 & 1) * *(int *)(local_2810.hit + 0x30) |
                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_2810.ray + 0xf0);
                *(uint *)(local_2810.ray + 0xf4) =
                     (uint)bVar36 * iVar2 | (uint)!bVar36 * *(int *)(local_2810.ray + 0xf4);
                *(uint *)(local_2810.ray + 0xf8) =
                     (uint)bVar7 * iVar23 | (uint)!bVar7 * *(int *)(local_2810.ray + 0xf8);
                *(uint *)(local_2810.ray + 0xfc) =
                     (uint)bVar8 * iVar24 | (uint)!bVar8 * *(int *)(local_2810.ray + 0xfc);
                iVar2 = *(int *)(local_2810.hit + 0x44);
                iVar23 = *(int *)(local_2810.hit + 0x48);
                iVar24 = *(int *)(local_2810.hit + 0x4c);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar8 = SUB81(uVar38 >> 3,0);
                *(uint *)(local_2810.ray + 0x100) =
                     (uint)(bVar29 & 1) * *(int *)(local_2810.hit + 0x40) |
                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_2810.ray + 0x100);
                *(uint *)(local_2810.ray + 0x104) =
                     (uint)bVar36 * iVar2 | (uint)!bVar36 * *(int *)(local_2810.ray + 0x104);
                *(uint *)(local_2810.ray + 0x108) =
                     (uint)bVar7 * iVar23 | (uint)!bVar7 * *(int *)(local_2810.ray + 0x108);
                *(uint *)(local_2810.ray + 0x10c) =
                     (uint)bVar8 * iVar24 | (uint)!bVar8 * *(int *)(local_2810.ray + 0x10c);
                auVar4 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar4;
                auVar4 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar4;
                auVar4 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar4;
                auVar4 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar4;
                auVar98 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar74 = auVar98._0_4_;
              auVar66._4_4_ = uVar74;
              auVar66._0_4_ = uVar74;
              auVar66._8_4_ = uVar74;
              auVar66._12_4_ = uVar74;
              auVar66._16_4_ = uVar74;
              auVar66._20_4_ = uVar74;
              auVar66._24_4_ = uVar74;
              auVar66._28_4_ = uVar74;
              uVar38 = vcmpps_avx512vl(auVar67._0_32_,auVar66,2);
              uVar37 = (byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar37) & uVar38;
            }
            bVar29 = (byte)uVar37;
            if (bVar29 == 0) break;
            auVar65._8_4_ = 0x7f800000;
            auVar65._0_8_ = 0x7f8000007f800000;
            auVar65._12_4_ = 0x7f800000;
            auVar65._16_4_ = 0x7f800000;
            auVar65._20_4_ = 0x7f800000;
            auVar65._24_4_ = 0x7f800000;
            auVar65._28_4_ = 0x7f800000;
            auVar39 = vblendmps_avx512vl(auVar65,auVar67._0_32_);
            auVar63._0_4_ =
                 (uint)(bVar29 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar29 & 1) * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar63._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar63._16_4_ = (uint)bVar36 * auVar39._16_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar63._20_4_ = (uint)bVar36 * auVar39._20_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar63._24_4_ = (uint)bVar36 * auVar39._24_4_ | (uint)!bVar36 * 0x7f800000;
            bVar36 = SUB81(uVar37 >> 7,0);
            auVar63._28_4_ = (uint)bVar36 * auVar39._28_4_ | (uint)!bVar36 * 0x7f800000;
            auVar39 = vshufps_avx(auVar63,auVar63,0xb1);
            auVar39 = vminps_avx(auVar63,auVar39);
            auVar40 = vshufpd_avx(auVar39,auVar39,5);
            auVar39 = vminps_avx(auVar39,auVar40);
            auVar40 = vpermpd_avx2(auVar39,0x4e);
            auVar39 = vminps_avx(auVar39,auVar40);
            uVar14 = vcmpps_avx512vl(auVar63,auVar39,0);
            bVar29 = (byte)uVar14 & bVar29;
            uVar30 = (uint)uVar37;
            if (bVar29 != 0) {
              uVar30 = (uint)bVar29;
            }
            uVar28 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
              uVar28 = uVar28 + 1;
            }
          } while( true );
        }
      }
    }
    auVar98 = ZEXT3264(local_2600);
    fVar76 = local_25a0;
    fVar78 = fStack_259c;
    fVar79 = fStack_2598;
    fVar80 = fStack_2594;
    fVar81 = fStack_2590;
    fVar82 = fStack_258c;
    fVar83 = fStack_2588;
    fVar84 = local_25c0;
    fVar85 = fStack_25bc;
    fVar86 = fStack_25b8;
    fVar87 = fStack_25b4;
    fVar88 = fStack_25b0;
    fVar89 = fStack_25ac;
    fVar90 = fStack_25a8;
    fVar91 = local_25e0;
    fVar92 = fStack_25dc;
    fVar93 = fStack_25d8;
    fVar94 = fStack_25d4;
    fVar95 = fStack_25d0;
    fVar96 = fStack_25cc;
    fVar97 = fStack_25c8;
  }
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar67 = ZEXT3264(CONCAT428(uVar74,CONCAT424(uVar74,CONCAT420(uVar74,CONCAT416(uVar74,CONCAT412(
                                                  uVar74,CONCAT48(uVar74,CONCAT44(uVar74,uVar74)))))
                                               )));
  auVar39 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar99 = ZEXT3264(auVar39);
  auVar100 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01db163f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }